

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
cs::translator_type::match_grammar
          (translator_type *this,context_t *context,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  long *plVar3;
  _Map_pointer ppptVar4;
  _Map_pointer ppptVar5;
  token_base *ptVar6;
  int iVar7;
  const_iterator cVar8;
  action_types *paVar9;
  _Elt_pointer pptVar10;
  token_base **pptVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  long lVar16;
  token_base **it;
  long *plVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  long *local_70;
  long local_68;
  long *local_60;
  long local_40;
  
  p_Var1 = (this->m_data).
           super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)this) {
      return;
    }
    sVar2 = *(size_t *)
             &((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                *)(p_Var1 + 1))->
              super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
    ;
    plVar17 = *(long **)(sVar2 + 0x10);
    plVar3 = *(long **)(sVar2 + 0x30);
    if (plVar17 == plVar3) {
      uVar18 = 0;
      bVar15 = false;
      bVar19 = false;
    }
    else {
      local_60 = *(long **)(sVar2 + 0x20);
      local_40 = *(long *)(sVar2 + 0x28);
      bVar19 = false;
      bVar20 = false;
      bVar15 = false;
      uVar18 = 0;
      do {
        iVar7 = (**(code **)(*(long *)*plVar17 + 0x10))();
        if (iVar7 == 0xc) {
          bVar15 = true;
        }
        else if (iVar7 == 2) {
          if (bVar15) {
            lVar16 = uVar18 * 8;
            while( true ) {
              ppptVar4 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_node;
              ppptVar5 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_node;
              pptVar10 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              if (((long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar10 >> 3) +
                  ((long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                  ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
                  (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar18) break;
              lVar13 = (long)pptVar10 -
                       (long)(raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar12 = uVar18 + lVar13;
              if (uVar12 < 0x40) {
                pptVar11 = (token_base **)((long)pptVar10 + lVar16);
              }
              else {
                uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar12) {
                  uVar14 = uVar12 >> 6;
                }
                pptVar11 = ppptVar5[uVar14] + lVar13 + uVar14 * -0x40 + uVar18;
              }
              iVar7 = (*(*pptVar11)->_vptr_token_base[2])();
              pptVar10 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar12 = ((long)pptVar10 -
                        (long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
              if (iVar7 == 4) {
                if (uVar12 < 0x40) {
                  pptVar11 = (token_base **)((long)pptVar10 + lVar16);
                }
                else {
                  uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar12) {
                    uVar14 = uVar12 >> 6;
                  }
                  pptVar11 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                             uVar12 + uVar14 * -0x40;
                }
                ptVar6 = *pptVar11;
                cVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                                *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                if ((cVar8._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) &&
                   (paVar9 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                             ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                      *)compiler_type::action_map_abi_cxx11_,
                                     (key_type *)(ptVar6 + 3)),
                   *paVar9 == *(action_types *)(*plVar17 + 0x10))) break;
              }
              else {
                if (uVar12 < 0x40) {
                  pptVar11 = (token_base **)((long)pptVar10 + lVar16);
                }
                else {
                  uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar12) {
                    uVar14 = uVar12 >> 6;
                  }
                  pptVar11 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                             uVar12 + uVar14 * -0x40;
                }
                iVar7 = (*(*pptVar11)->_vptr_token_base[2])();
                if (iVar7 == 2) break;
              }
              uVar18 = uVar18 + 1;
              lVar16 = lVar16 + 8;
            }
          }
          ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar5 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_node;
          pptVar10 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_cur;
          if (uVar18 < ((long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar10 >>
                       3) + ((long)(raw->
                                   super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                   )._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)(raw->
                                   super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                   )._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                       ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
                       (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40) {
            uVar12 = ((long)pptVar10 -
                      (long)(raw->
                            super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
            if (uVar12 < 0x40) {
              pptVar11 = pptVar10 + uVar18;
            }
            else {
              uVar14 = uVar12 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar12) {
                uVar14 = uVar12 >> 6;
              }
              pptVar11 = ppptVar5[uVar14] + uVar12 + uVar14 * -0x40;
            }
            iVar7 = (*(*pptVar11)->_vptr_token_base[2])();
            pptVar10 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar12 = ((long)pptVar10 -
                      (long)(raw->
                            super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
            if (iVar7 == 4) {
              if (uVar12 < 0x40) {
                pptVar10 = pptVar10 + uVar18;
              }
              else {
                uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar12) {
                  uVar14 = uVar12 >> 6;
                }
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                           uVar12 + uVar14 * -0x40;
              }
              ptVar6 = *pptVar10;
              cVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                              *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
              if (cVar8._M_node == (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) {
                bVar20 = true;
                bVar19 = false;
              }
              else {
                paVar9 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                         ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                  *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                bVar19 = *paVar9 == *(action_types *)(*plVar17 + 0x10);
                if (!bVar19) {
                  bVar20 = true;
                }
              }
            }
            else {
              if (uVar12 < 0x40) {
                pptVar10 = pptVar10 + uVar18;
              }
              else {
                uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar12) {
                  uVar14 = uVar12 >> 6;
                }
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                           uVar12 + uVar14 * -0x40;
              }
              iVar7 = (*(*pptVar10)->_vptr_token_base[2])();
              bVar20 = true;
              if (iVar7 == 2) {
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                uVar12 = ((long)pptVar10 -
                          (long)(raw->
                                super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
                if (uVar12 < 0x40) {
                  pptVar10 = pptVar10 + uVar18;
                }
                else {
                  uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar12) {
                    uVar14 = uVar12 >> 6;
                  }
                  pptVar10 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                             uVar12 + uVar14 * -0x40;
                }
                bVar20 = *(int *)&(*pptVar10)[1]._vptr_token_base != *(int *)(*plVar17 + 0x10);
              }
            }
            uVar18 = uVar18 + 1;
            bVar15 = false;
          }
          else {
            bVar20 = true;
          }
        }
        if (bVar20) break;
        plVar17 = plVar17 + 1;
        if (plVar17 == local_60) {
          plVar17 = *(long **)(local_40 + 8);
          local_40 = local_40 + 8;
          local_60 = plVar17 + 0x40;
        }
      } while (plVar17 != plVar3);
    }
    if (bVar15) {
      ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (uVar18 == ((long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                    ((long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                    ((((ulong)((long)ppptVar4 -
                              (long)(raw->
                                    super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                    )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40) {
LAB_0028c975:
        bVar19 = false;
      }
    }
    else {
      ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (uVar18 < ((long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(raw->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)ppptVar4 -
                             (long)(raw->
                                   super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                   )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40) goto LAB_0028c975;
    }
    if (bVar19) {
      sVar2 = *(size_t *)
               &((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                  *)(p_Var1 + 1))->
                super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
      ;
      plVar17 = *(long **)(sVar2 + 0x10);
      plVar3 = *(long **)(sVar2 + 0x30);
      if (plVar17 != plVar3) {
        local_70 = *(long **)(sVar2 + 0x20);
        local_68 = *(long *)(sVar2 + 0x28);
        uVar18 = 0;
        bVar15 = false;
        do {
          iVar7 = (**(code **)(*(long *)*plVar17 + 0x10))();
          if (iVar7 == 0xc) {
            bVar15 = true;
          }
          else if (iVar7 == 2) {
            if (bVar15) {
              lVar16 = uVar18 * 8;
              while( true ) {
                ppptVar4 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_node;
                ppptVar5 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node;
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                if (((long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar10 >> 3) +
                    ((long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                    ((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
                    (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 <= uVar18) break;
                lVar13 = (long)pptVar10 -
                         (long)(raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
                uVar12 = uVar18 + lVar13;
                if (uVar12 < 0x40) {
                  pptVar11 = (token_base **)((long)pptVar10 + lVar16);
                }
                else {
                  uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar12) {
                    uVar14 = uVar12 >> 6;
                  }
                  pptVar11 = ppptVar5[uVar14] + lVar13 + uVar14 * -0x40 + uVar18;
                }
                iVar7 = (*(*pptVar11)->_vptr_token_base[2])();
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                uVar12 = ((long)pptVar10 -
                          (long)(raw->
                                super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
                if (iVar7 == 4) {
                  if (uVar12 < 0x40) {
                    pptVar11 = (token_base **)((long)pptVar10 + lVar16);
                  }
                  else {
                    uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar12) {
                      uVar14 = uVar12 >> 6;
                    }
                    pptVar11 = (raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                               uVar12 + uVar14 * -0x40;
                  }
                  ptVar6 = *pptVar11;
                  cVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                                  *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                  if ((cVar8._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) &&
                     (paVar9 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                        *)compiler_type::action_map_abi_cxx11_,
                                       (key_type *)(ptVar6 + 3)),
                     *paVar9 == *(action_types *)(*plVar17 + 0x10))) break;
                }
                else {
                  if (uVar12 < 0x40) {
                    pptVar11 = (token_base **)((long)pptVar10 + lVar16);
                  }
                  else {
                    uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar12) {
                      uVar14 = uVar12 >> 6;
                    }
                    pptVar11 = (raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                               uVar12 + uVar14 * -0x40;
                  }
                  iVar7 = (*(*pptVar11)->_vptr_token_base[2])();
                  if (iVar7 == 2) break;
                }
                uVar18 = uVar18 + 1;
                lVar16 = lVar16 + 8;
              }
            }
            pptVar10 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar12 = ((long)pptVar10 -
                      (long)(raw->
                            super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
            if (uVar12 < 0x40) {
              pptVar10 = pptVar10 + uVar18;
            }
            else {
              uVar14 = uVar12 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar12) {
                uVar14 = uVar12 >> 6;
              }
              pptVar10 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                         uVar12 + uVar14 * -0x40;
            }
            iVar7 = (*(*pptVar10)->_vptr_token_base[2])();
            if (iVar7 == 4) {
              pptVar10 = (raw->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar12 = ((long)pptVar10 -
                        (long)(raw->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
              if (uVar12 < 0x40) {
                pptVar10 = pptVar10 + uVar18;
              }
              else {
                uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar12) {
                  uVar14 = uVar12 >> 6;
                }
                pptVar10 = (raw->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                           uVar12 + uVar14 * -0x40;
              }
              ptVar6 = *pptVar10;
              cVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>_>_>
                              *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
              if (cVar8._M_node != (_Base_ptr)(compiler_type::action_map_abi_cxx11_ + 8)) {
                paVar9 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                         ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                  *)compiler_type::action_map_abi_cxx11_,(key_type *)(ptVar6 + 3));
                if (*paVar9 == *(action_types *)&((token_base *)*plVar17)[1]._vptr_token_base) {
                  pptVar10 = (raw->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  uVar12 = ((long)pptVar10 -
                            (long)(raw->
                                  super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                  )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
                  if (uVar12 < 0x40) {
                    pptVar10 = pptVar10 + uVar18;
                  }
                  else {
                    uVar14 = uVar12 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar12) {
                      uVar14 = uVar12 >> 6;
                    }
                    pptVar10 = (raw->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] +
                               uVar12 + uVar14 * -0x40;
                  }
                  *pptVar10 = (token_base *)*plVar17;
                }
              }
            }
            uVar18 = uVar18 + 1;
            bVar15 = false;
          }
          plVar17 = plVar17 + 1;
          if (plVar17 == local_70) {
            plVar17 = *(long **)(local_68 + 8);
            local_68 = local_68 + 8;
            local_70 = plVar17 + 0x40;
          }
        } while (plVar17 != plVar3);
      }
    }
    p_Var1 = (((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                *)&p_Var1->_M_next)->
             super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

void translator_type::match_grammar(const context_t &context, std::deque<token_base *> &raw)
	{
		for (auto &dat: m_data) {
			bool matched = false;
			{
				bool failed = false, skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (i >= raw.size()) {
							failed = true;
							break;
						}
						// The "matched" condition is satisfied only if the target token is an id and it can match the grammar rule.
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (!context->compiler->action_map.exist(id) ||
							        context->compiler->action_map.match(id) !=
							        static_cast<token_action *>(it)->get_action()) {
								matched = false;
								failed = true;
							}
							else
								matched = true;
						}
						else if (raw[i]->get_type() == token_types::action)
							failed = static_cast<token_action *>(raw[i])->get_action() !=
							         static_cast<token_action *>(it)->get_action();
						else
							failed = true;
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
					if (failed)
						break;
				}
				if ((skip_useless && i == raw.size()) || (!skip_useless && i < raw.size()))
					matched = false;
			}
			if (matched) {
				// If matched, find and replace all id token with correspondent action token.
				bool skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (context->compiler->action_map.exist(id) &&
							        context->compiler->action_map.match(id) ==
							        static_cast<token_action *>(it)->get_action())
								raw[i] = it;
						}
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
				}
			}
		}
	}